

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

int __thiscall AddrManImpl::CheckAddrman(AddrManImpl *this)

{
  key_type *__k;
  pointer piVar1;
  string prefix;
  string end_msg;
  Network NVar2;
  uint uVar3;
  mapped_type *pmVar4;
  uint *puVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  uchar *puVar11;
  ulong uVar12;
  __node_base *p_Var13;
  int iVar14;
  unsigned_long *in_R9;
  __node_base *p_Var15;
  int (*paiVar16) [64];
  long lVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  byte bVar19;
  int n;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  local_counts;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  mapNew;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> setTried;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer2;
  undefined8 in_stack_fffffffffffffe48;
  int *args;
  int (*paiVar20) [64];
  undefined8 in_stack_fffffffffffffe50;
  int *fmt;
  uint256 *nKey;
  undefined1 in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe59;
  undefined8 in_stack_fffffffffffffe60;
  _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  key_type in_stack_fffffffffffffe74;
  int iVar21;
  __buckets_ptr in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_150;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_118;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_e0;
  string local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CheckAddrman","");
  fmt = &this->nNew;
  args = &this->nTried;
  local_118._M_buckets =
       (__buckets_ptr)
       ((long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2);
  tinyformat::format<int,int,unsigned_long>
            (&local_d8,(tinyformat *)"new %i, tried %i, total %u",(char *)fmt,args,(int *)&local_118
             ,in_R9);
  prefix._M_string_length = in_stack_fffffffffffffe50;
  prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  prefix.field_2._M_local_buf[0] = in_stack_fffffffffffffe58;
  prefix.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffffe59;
  prefix.field_2._8_8_ = in_stack_fffffffffffffe60;
  end_msg._M_string_length._0_4_ = in_stack_fffffffffffffe70;
  end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
  end_msg._M_string_length._4_4_ = in_stack_fffffffffffffe74;
  end_msg.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe78;
  end_msg.field_2._8_8_ = in_stack_fffffffffffffe80;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            (&local_98,prefix,end_msg,(LogFlags)local_b8,SUB81(&local_d8,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  local_118._M_buckets = &local_118._M_single_bucket;
  local_118._M_bucket_count = 1;
  local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_118._M_element_count = 0;
  local_118._M_rehash_policy._M_max_load_factor = 1.0;
  local_118._M_rehash_policy._M_next_resize = 0;
  local_118._M_single_bucket = (__node_base_ptr)0x0;
  local_150._M_buckets = &local_150._M_single_bucket;
  local_150._M_bucket_count = 1;
  local_150._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_150._M_element_count = 0;
  local_150._M_rehash_policy._M_max_load_factor = 1.0;
  local_150._M_rehash_policy._M_next_resize = 0;
  local_150._M_single_bucket = (__node_base_ptr)0x0;
  iVar14 = -7;
  if ((long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 == (long)this->nNew + (long)this->nTried) {
    this_00 = &(this->mapInfo)._M_h;
    p_Var15 = &(this->mapInfo)._M_h._M_before_begin;
    do {
      p_Var15 = p_Var15->_M_nxt;
      if (p_Var15 == (__node_base *)0x0) {
        iVar14 = -9;
        if ((local_118._M_element_count == (long)*args) &&
           (iVar14 = -10, local_150._M_element_count == (long)*fmt)) {
          paiVar16 = this->vvTried;
          nKey = &this->nKey;
          uVar12 = 0;
          bVar19 = false;
          iVar14 = -0x11;
          do {
            uVar18 = 0;
            paiVar20 = paiVar16;
            do {
              if ((*paiVar16)[0] != -1) {
                cVar7 = std::
                        _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::find(&local_118,*paiVar16);
                if (cVar7.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
                  iVar14 = -0xb;
                }
                else {
                  cVar8 = std::
                          _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(this_00,*paiVar16);
                  if (cVar8.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur
                      != (__node_type *)0x0) {
                    uVar3 = AddrInfo::GetTriedBucket
                                      ((AddrInfo *)
                                       ((long)cVar8.
                                              super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                              ._M_cur + 0x10),nKey,this->m_netgroupman);
                    if (uVar12 == uVar3) {
                      uVar3 = AddrInfo::GetBucketPosition
                                        ((AddrInfo *)
                                         ((long)cVar8.
                                                super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                                ._M_cur + 0x10),nKey,false,(int)uVar12);
                      if (uVar18 == uVar3) {
                        std::
                        _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::_M_erase(&local_118,paiVar16);
                        goto LAB_0044bddc;
                      }
                      iVar14 = -0x12;
                      goto LAB_0044be42;
                    }
                  }
                }
                if ((bVar19 & 1) != 0) goto LAB_0044bea7;
                goto LAB_0044be42;
              }
LAB_0044bddc:
              uVar18 = uVar18 + 1;
              paiVar16 = (int (*) [64])(*paiVar16 + 1);
            } while (uVar18 != 0x40);
            bVar19 = 0xfe < uVar12;
            uVar12 = uVar12 + 1;
            paiVar16 = paiVar20 + 1;
          } while (uVar12 != 0x100);
LAB_0044bea7:
          paiVar16 = this->vvNew;
          lVar17 = 0;
          iVar14 = -0x13;
          do {
            uVar12 = 0;
            paiVar20 = paiVar16;
            do {
              if ((*paiVar16)[0] != -1) {
                cVar9 = std::
                        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(&local_150,*paiVar16);
                if (cVar9.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
                    (__node_type *)0x0) {
                  iVar14 = -0xc;
                  goto LAB_0044be42;
                }
                cVar8 = std::
                        _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(this_00,*paiVar16);
                if ((cVar8.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur
                     == (__node_type *)0x0) ||
                   (uVar3 = AddrInfo::GetBucketPosition
                                      ((AddrInfo *)
                                       ((long)cVar8.
                                              super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                              ._M_cur + 0x10),nKey,true,(int)lVar17),
                   uVar12 != uVar3)) goto LAB_0044be42;
                pmVar10 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_150,*paiVar16);
                *pmVar10 = *pmVar10 + -1;
                if (*pmVar10 == 0) {
                  std::
                  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_erase(&local_150,paiVar16);
                }
              }
              uVar12 = uVar12 + 1;
              paiVar16 = (int (*) [64])(*paiVar16 + 1);
            } while (uVar12 != 0x40);
            lVar17 = lVar17 + 1;
            paiVar16 = paiVar20 + 1;
          } while (lVar17 != 0x400);
          iVar14 = -0xd;
          if ((local_118._M_element_count == 0) && (iVar14 = -0xf, local_150._M_element_count == 0))
          {
            puVar11 = std::
                      __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                (nKey,&this->nIdCount);
            if ((int *)puVar11 == &this->nIdCount) {
              iVar14 = -0x10;
            }
            else {
              p_Var13 = &(this->m_network_counts)._M_h._M_before_begin;
              iVar14 = -0x15;
              while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
                pmVar4 = std::__detail::
                         _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&stack0xfffffffffffffe78,(key_type *)(p_Var13 + 1));
                if (((_Hash_node_base *)pmVar4->n_new !=
                     *(_Hash_node_base **)
                      &((_Prime_rehash_policy *)(p_Var13 + 2))->_M_max_load_factor) ||
                   (pmVar4 = std::__detail::
                             _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)&stack0xfffffffffffffe78,(key_type *)(p_Var13 + 1)),
                   (_Hash_node_base *)pmVar4->n_tried != p_Var13[3]._M_nxt)) goto LAB_0044be42;
              }
              iVar14 = 0;
            }
          }
        }
        goto LAB_0044be42;
      }
      iVar21 = (int)*(size_type *)(p_Var15 + 1);
      __k = (key_type *)(p_Var15 + 2);
      if (*(char *)&p_Var15[0x11]._M_nxt == '\x01') {
        if (p_Var15[0xf]._M_nxt == (_Hash_node_base *)0x0) {
          iVar14 = -1;
          goto LAB_0044be42;
        }
        if (*(int *)((long)&p_Var15[0x10]._M_nxt + 4) != 0) {
          iVar14 = -2;
          goto LAB_0044be42;
        }
        local_e0 = &local_118;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_e0,&stack0xfffffffffffffe74,&local_e0);
        NVar2 = CNetAddr::GetNetwork((CNetAddr *)__k);
        local_e0 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_e0._4_4_,NVar2);
        pmVar4 = std::__detail::
                 _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&stack0xfffffffffffffe78,(key_type *)&local_e0);
        pmVar4->n_tried = pmVar4->n_tried + 1;
      }
      else {
        uVar3 = *(uint *)((long)&p_Var15[0x10]._M_nxt + 4);
        if (8 < uVar3) {
          iVar14 = -3;
          goto LAB_0044be42;
        }
        if (uVar3 == 0) {
          iVar14 = -4;
          goto LAB_0044be42;
        }
        puVar5 = (uint *)std::__detail::
                         _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_150,(key_type *)&stack0xfffffffffffffe74);
        *puVar5 = uVar3;
        NVar2 = CNetAddr::GetNetwork((CNetAddr *)__k);
        local_e0 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_e0._4_4_,NVar2);
        pmVar4 = std::__detail::
                 _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&stack0xfffffffffffffe78,(key_type *)&local_e0);
        pmVar4->n_new = pmVar4->n_new + 1;
      }
      cVar6 = std::
              _Hashtable<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->mapAddr)._M_h,__k);
      iVar14 = -5;
      if ((cVar6.super__Node_iterator_base<std::pair<const_CService,_int>,_false>._M_cur ==
           (__node_type *)0x0) ||
         (*(int *)((long)cVar6.super__Node_iterator_base<std::pair<const_CService,_int>,_false>.
                         _M_cur + 0x30) != iVar21)) goto LAB_0044be42;
      uVar12 = (ulong)*(int *)((long)&p_Var15[0x11]._M_nxt + 4);
      iVar14 = -0xe;
      if (((long)uVar12 < 0) ||
         ((piVar1 = (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (ulong)((long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar12 ||
          (piVar1[uVar12] !=
           *(int *)((long)cVar6.super__Node_iterator_base<std::pair<const_CService,_int>,_false>.
                          _M_cur + 0x30))))) goto LAB_0044be42;
      if ((long)p_Var15[9]._M_nxt < 0) {
        iVar14 = -6;
        goto LAB_0044be42;
      }
    } while (-1 < (long)p_Var15[0xf]._M_nxt);
    iVar14 = -8;
  }
LAB_0044be42:
  std::
  _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&stack0xfffffffffffffe78);
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_150);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_118);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar14;
  }
  __stack_chk_fail();
}

Assistant:

int AddrManImpl::CheckAddrman() const
{
    AssertLockHeld(cs);

    LOG_TIME_MILLIS_WITH_CATEGORY_MSG_ONCE(
        strprintf("new %i, tried %i, total %u", nNew, nTried, vRandom.size()), BCLog::ADDRMAN);

    std::unordered_set<int> setTried;
    std::unordered_map<int, int> mapNew;
    std::unordered_map<Network, NewTriedCount> local_counts;

    if (vRandom.size() != (size_t)(nTried + nNew))
        return -7;

    for (const auto& entry : mapInfo) {
        int n = entry.first;
        const AddrInfo& info = entry.second;
        if (info.fInTried) {
            if (!TicksSinceEpoch<std::chrono::seconds>(info.m_last_success)) {
                return -1;
            }
            if (info.nRefCount)
                return -2;
            setTried.insert(n);
            local_counts[info.GetNetwork()].n_tried++;
        } else {
            if (info.nRefCount < 0 || info.nRefCount > ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
                return -3;
            if (!info.nRefCount)
                return -4;
            mapNew[n] = info.nRefCount;
            local_counts[info.GetNetwork()].n_new++;
        }
        const auto it{mapAddr.find(info)};
        if (it == mapAddr.end() || it->second != n) {
            return -5;
        }
        if (info.nRandomPos < 0 || (size_t)info.nRandomPos >= vRandom.size() || vRandom[info.nRandomPos] != n)
            return -14;
        if (info.m_last_try < NodeSeconds{0s}) {
            return -6;
        }
        if (info.m_last_success < NodeSeconds{0s}) {
            return -8;
        }
    }

    if (setTried.size() != (size_t)nTried)
        return -9;
    if (mapNew.size() != (size_t)nNew)
        return -10;

    for (int n = 0; n < ADDRMAN_TRIED_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvTried[n][i] != -1) {
                if (!setTried.count(vvTried[n][i]))
                    return -11;
                const auto it{mapInfo.find(vvTried[n][i])};
                if (it == mapInfo.end() || it->second.GetTriedBucket(nKey, m_netgroupman) != n) {
                    return -17;
                }
                if (it->second.GetBucketPosition(nKey, false, n) != i) {
                    return -18;
                }
                setTried.erase(vvTried[n][i]);
            }
        }
    }

    for (int n = 0; n < ADDRMAN_NEW_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[n][i] != -1) {
                if (!mapNew.count(vvNew[n][i]))
                    return -12;
                const auto it{mapInfo.find(vvNew[n][i])};
                if (it == mapInfo.end() || it->second.GetBucketPosition(nKey, true, n) != i) {
                    return -19;
                }
                if (--mapNew[vvNew[n][i]] == 0)
                    mapNew.erase(vvNew[n][i]);
            }
        }
    }

    if (setTried.size())
        return -13;
    if (mapNew.size())
        return -15;
    if (nKey.IsNull())
        return -16;

    // It's possible that m_network_counts may have all-zero entries that local_counts
    // doesn't have if addrs from a network were being added and then removed again in the past.
    if (m_network_counts.size() < local_counts.size()) {
        return -20;
    }
    for (const auto& [net, count] : m_network_counts) {
        if (local_counts[net].n_new != count.n_new || local_counts[net].n_tried != count.n_tried) {
            return -21;
        }
    }

    return 0;
}